

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  bool bVar1;
  bool bVar2;
  reference rhs;
  reference ppVar3;
  bool local_591;
  bool local_57b;
  bool local_566;
  bool local_562;
  bool local_559;
  path *element_1;
  iterator __end2_1;
  iterator __begin2_1;
  input_iterator_range<ghc::filesystem::path::iterator> local_478;
  input_iterator_range<ghc::filesystem::path::iterator> *local_3f8;
  input_iterator_range<ghc::filesystem::path::iterator> *__range2_1;
  int i;
  byte local_3c1;
  path local_3c0;
  byte local_399;
  path local_398;
  path local_378;
  reference local_358;
  path *element;
  iterator __end2;
  iterator __begin2;
  input_iterator_range<ghc::filesystem::path::iterator> local_290;
  input_iterator_range<ghc::filesystem::path::iterator> *local_210;
  input_iterator_range<ghc::filesystem::path::iterator> *__range2;
  undefined4 local_200;
  int count;
  iterator local_1f8;
  iterator local_1b8;
  byte local_171;
  iterator local_170;
  iterator local_130;
  undefined1 local_f0 [8];
  const_iterator b;
  const_iterator a;
  path local_60;
  path local_40;
  path *local_20;
  path *base_local;
  path *this_local;
  path *result;
  
  local_20 = base;
  base_local = this;
  this_local = __return_storage_ptr__;
  root_name(&local_40,this);
  root_name(&local_60,local_20);
  bVar1 = filesystem::operator!=(&local_40,&local_60);
  local_559 = true;
  if (!bVar1) {
    bVar1 = is_absolute(this);
    bVar2 = is_absolute(local_20);
    local_559 = true;
    if (bVar1 == bVar2) {
      bVar1 = has_root_directory(this);
      local_562 = false;
      if (!bVar1) {
        local_562 = has_root_directory(local_20);
      }
      local_559 = local_562;
    }
  }
  ~path(&local_60);
  ~path(&local_40);
  if (local_559 == false) {
    begin((iterator *)((long)&b._current._path.field_2 + 8),this);
    begin((iterator *)local_f0,local_20);
    while( true ) {
      local_171 = 0;
      end(&local_130,this);
      bVar1 = iterator::operator!=((iterator *)((long)&b._current._path.field_2 + 8),&local_130);
      local_566 = false;
      if (bVar1) {
        end(&local_170,local_20);
        local_171 = 1;
        bVar1 = iterator::operator!=((iterator *)local_f0,&local_170);
        local_566 = false;
        if (bVar1) {
          ppVar3 = iterator::operator*((iterator *)((long)&b._current._path.field_2 + 8));
          rhs = iterator::operator*((iterator *)local_f0);
          local_566 = filesystem::operator==(ppVar3,rhs);
        }
      }
      if ((local_171 & 1) != 0) {
        iterator::~iterator(&local_170);
      }
      iterator::~iterator(&local_130);
      if (local_566 == false) break;
      iterator::operator++((iterator *)((long)&b._current._path.field_2 + 8));
      iterator::operator++((iterator *)local_f0);
    }
    count._3_1_ = 0;
    end(&local_1b8,this);
    bVar1 = iterator::operator==((iterator *)((long)&b._current._path.field_2 + 8),&local_1b8);
    local_57b = false;
    if (bVar1) {
      end(&local_1f8,local_20);
      count._3_1_ = 1;
      local_57b = iterator::operator==((iterator *)local_f0,&local_1f8);
    }
    if ((count._3_1_ & 1) != 0) {
      iterator::~iterator(&local_1f8);
    }
    iterator::~iterator(&local_1b8);
    if (local_57b == false) {
      __range2._4_4_ = 0;
      end((iterator *)((long)&__begin2._current._path.field_2 + 8),local_20);
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                (&local_290,(iterator *)local_f0,
                 (iterator *)((long)&__begin2._current._path.field_2 + 8));
      iterator::~iterator((iterator *)((long)&__begin2._current._path.field_2 + 8));
      local_210 = &local_290;
      input_iterator_range<ghc::filesystem::path::iterator>::begin
                ((iterator *)((long)&__end2._current._path.field_2 + 8),local_210);
      input_iterator_range<ghc::filesystem::path::iterator>::end((iterator *)&element,local_210);
      while (bVar1 = iterator::operator!=
                               ((iterator *)((long)&__end2._current._path.field_2 + 8),
                                (iterator *)&element), bVar1) {
        ppVar3 = iterator::operator*((iterator *)((long)&__end2._current._path.field_2 + 8));
        local_399 = 0;
        local_3c1 = 0;
        local_358 = ppVar3;
        path<char[2],ghc::filesystem::path>(&local_378,(char (*) [2])0x226cb1,auto_format);
        bVar1 = filesystem::operator!=(ppVar3,&local_378);
        ppVar3 = local_358;
        local_591 = false;
        if (bVar1) {
          path<char[1],ghc::filesystem::path>(&local_398,(char (*) [1])0x228cc2,auto_format);
          local_399 = 1;
          bVar1 = filesystem::operator!=(ppVar3,&local_398);
          ppVar3 = local_358;
          local_591 = false;
          if (bVar1) {
            path<char[3],ghc::filesystem::path>(&local_3c0,(char (*) [3])"..",auto_format);
            local_3c1 = 1;
            local_591 = filesystem::operator!=(ppVar3,&local_3c0);
          }
        }
        if ((local_3c1 & 1) != 0) {
          ~path(&local_3c0);
        }
        if ((local_399 & 1) != 0) {
          ~path(&local_398);
        }
        ~path(&local_378);
        ppVar3 = local_358;
        if (local_591 == false) {
          path<char[3],ghc::filesystem::path>((path *)&i,(char (*) [3])"..",auto_format);
          bVar1 = filesystem::operator==(ppVar3,(path *)&i);
          ~path((path *)&i);
          if (bVar1) {
            __range2._4_4_ = __range2._4_4_ + -1;
          }
        }
        else {
          __range2._4_4_ = __range2._4_4_ + 1;
        }
        iterator::operator++((iterator *)((long)&__end2._current._path.field_2 + 8));
      }
      local_200 = 4;
      iterator::~iterator((iterator *)&element);
      iterator::~iterator((iterator *)((long)&__end2._current._path.field_2 + 8));
      input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range(&local_290);
      if (__range2._4_4_ < 0) {
        path(__return_storage_ptr__);
      }
      else {
        __range2_1._7_1_ = 0;
        path(__return_storage_ptr__);
        for (__range2_1._0_4_ = 0; (int)__range2_1 < __range2._4_4_;
            __range2_1._0_4_ = (int)__range2_1 + 1) {
          operator/=(__return_storage_ptr__,(char (*) [3])"..");
        }
        end((iterator *)((long)&__begin2_1._current._path.field_2 + 8),this);
        input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                  (&local_478,(iterator *)((long)&b._current._path.field_2 + 8),
                   (iterator *)((long)&__begin2_1._current._path.field_2 + 8));
        iterator::~iterator((iterator *)((long)&__begin2_1._current._path.field_2 + 8));
        local_3f8 = &local_478;
        input_iterator_range<ghc::filesystem::path::iterator>::begin
                  ((iterator *)((long)&__end2_1._current._path.field_2 + 8),local_3f8);
        input_iterator_range<ghc::filesystem::path::iterator>::end((iterator *)&element_1,local_3f8)
        ;
        while (bVar1 = iterator::operator!=
                                 ((iterator *)((long)&__end2_1._current._path.field_2 + 8),
                                  (iterator *)&element_1), bVar1) {
          ppVar3 = iterator::operator*((iterator *)((long)&__end2_1._current._path.field_2 + 8));
          operator/=(__return_storage_ptr__,ppVar3);
          iterator::operator++((iterator *)((long)&__end2_1._current._path.field_2 + 8));
        }
        local_200 = 9;
        iterator::~iterator((iterator *)&element_1);
        iterator::~iterator((iterator *)((long)&__end2_1._current._path.field_2 + 8));
        input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range(&local_478);
        __range2_1._7_1_ = 1;
      }
    }
    else {
      path<char[2],ghc::filesystem::path>(__return_storage_ptr__,(char (*) [2])0x226cb1,auto_format)
      ;
    }
    local_200 = 1;
    iterator::~iterator((iterator *)local_f0);
    iterator::~iterator((iterator *)((long)&b._current._path.field_2 + 8));
  }
  else {
    path(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}